

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_growbot(jit_State *J)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  long in_RDI;
  MSize ofs_1;
  IRIns *newbase;
  MSize ofs;
  MSize szins;
  IRIns *baseir;
  GCSize in_stack_ffffffffffffffc0;
  uint uVar6;
  GCSize in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  pvVar2 = (void *)(*(long *)(in_RDI + 0x138) + (ulong)*(uint *)(in_RDI + 0x144) * 8);
  uVar1 = *(int *)(in_RDI + 0x140) - *(int *)(in_RDI + 0x144);
  if (*(int *)(in_RDI + 8) + (uVar1 >> 1) < *(uint *)(in_RDI + 0x140)) {
    uVar1 = uVar1 >> 2;
    memmove((void *)((long)pvVar2 + (ulong)uVar1 * 8),pvVar2,
            (ulong)(uint)(*(int *)(in_RDI + 8) - *(int *)(in_RDI + 0x144)) << 3);
    *(uint *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) - uVar1;
    *(uint *)(in_RDI + 0x140) = *(int *)(in_RDI + 0x140) - uVar1;
    pvVar2 = (void *)((long)pvVar2 + (ulong)*(uint *)(in_RDI + 0x144) * -8);
    *(void **)(in_RDI + 0x138) = pvVar2;
    *(void **)(in_RDI + 0x10) = pvVar2;
  }
  else {
    pvVar3 = lj_mem_realloc((lua_State *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                            in_stack_ffffffffffffffc0);
    if (uVar1 < 0x100) {
      uVar6 = uVar1 >> 1;
    }
    else {
      uVar6 = 0x80;
    }
    memcpy((void *)((long)pvVar3 + (ulong)uVar6 * 8),pvVar2,
           (ulong)(uint)(*(int *)(in_RDI + 8) - *(int *)(in_RDI + 0x144)) << 3);
    uVar5 = (ulong)*(uint *)(*(long *)(in_RDI + 0x68) + 8);
    lVar4 = (ulong)uVar1 * 8;
    *(int *)(uVar5 + 0x50) = *(int *)(uVar5 + 0x50) - (int)lVar4;
    *(long *)(uVar5 + 0x90) = lVar4 + *(long *)(uVar5 + 0x90);
    (**(code **)(uVar5 + 0x40))(*(undefined8 *)(uVar5 + 0x48),pvVar2,lVar4,0);
    *(uint *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) - uVar6;
    *(uint *)(in_RDI + 0x140) = *(int *)(in_RDI + 0x144) + uVar1 * 2;
    pvVar3 = (void *)((long)pvVar3 + (ulong)*(uint *)(in_RDI + 0x144) * -8);
    *(void **)(in_RDI + 0x138) = pvVar3;
    *(void **)(in_RDI + 0x10) = pvVar3;
  }
  return;
}

Assistant:

static void lj_ir_growbot(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  lj_assertJ(szins != 0, "zero IR size");
  lj_assertJ(J->cur.nk == J->irbotlim || J->cur.nk-1 == J->irbotlim,
	     "unexpected IR growth");
  if (J->cur.nins + (szins >> 1) < J->irtoplim) {
    /* More than half of the buffer is free on top: shift up by a quarter. */
    MSize ofs = szins >> 2;
    memmove(baseir + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim -= ofs;
    J->cur.ir = J->irbuf = baseir - J->irbotlim;
  } else {
    /* Double the buffer size, but split the growth amongst top/bottom. */
    IRIns *newbase = lj_mem_newt(J->L, 2*szins*sizeof(IRIns), IRIns);
    MSize ofs = szins >= 256 ? 128 : (szins >> 1);  /* Limit bottom growth. */
    memcpy(newbase + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    lj_mem_free(G(J->L), baseir, szins*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim = J->irbotlim + 2*szins;
    J->cur.ir = J->irbuf = newbase - J->irbotlim;
  }
}